

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O0

double __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AcosId>_>
::maxErrorAbs(BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AcosId>_>
              *this,double x0,double y0,double x1,double y1)

{
  undefined8 uVar1;
  double *pdVar2;
  long *in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  double dVar4;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double yMid;
  double fMid;
  double xMid;
  double errMax;
  double f1;
  double f0;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  undefined8 in_stack_ffffffffffffffb0;
  Error *in_stack_ffffffffffffffb8;
  CStringRef in_stack_ffffffffffffffc0;
  BasicCStringRef<char> local_30;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  
  local_18 = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  if (in_XMM2_Qa <= in_XMM0_Qa) {
    uVar1 = __cxa_allocate_exception(0x18);
    fmt::BasicCStringRef<char>::BasicCStringRef
              (&local_30,"PLApprox maxErrAbs(): degenerate segment, x0>=x1");
    Error::Error(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0,
                 (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    __cxa_throw(uVar1,&Error::typeinfo,Error::~Error);
  }
  local_28 = in_XMM3_Qa;
  local_20 = in_XMM2_Qa;
  local_10 = in_XMM0_Qa;
  dVar3 = (double)(**(code **)(*in_RDI + 0x48))(in_XMM0_Qa);
  dVar4 = (double)(**(code **)(*in_RDI + 0x48))(local_20);
  local_60 = ABS(dVar3 - local_18);
  local_68 = ABS(dVar4 - local_28);
  pdVar2 = std::max<double>(&local_60,&local_68);
  local_58 = *pdVar2;
  local_70 = (double)(**(code **)(*in_RDI + 0x100))((local_28 - local_18) / (local_20 - local_10));
  local_78 = (double)(**(code **)(*in_RDI + 0x48))(local_70);
  local_80 = local_18 + ((local_28 - local_18) * (local_70 - local_10)) / (local_20 - local_10);
  local_88 = ABS(local_78 - local_80);
  pdVar2 = std::max<double>(&local_58,&local_88);
  return *pdVar2;
}

Assistant:

double BasicPLApproximator<FuncCon>::maxErrorAbs(
    double x0, double y0, double x1, double y1) {
  MP_ASSERT_ALWAYS(x1>x0,
                   "PLApprox maxErrAbs(): degenerate segment, x0>=x1");
  auto f0 = eval(x0);
  auto f1 = eval(x1);
  auto errMax = std::max( std::fabs(f0-y0), std::fabs(f1-y1) );
  auto xMid = inverse_1st_with_check( (y1-y0)/(x1-x0) );
  auto fMid = eval(xMid);
  auto yMid = y0 + (y1-y0) * (xMid-x0) / (x1-x0);
  errMax = std::max( errMax, std::fabs(fMid-yMid) );
  return errMax;
}